

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::hugeint_t,unsigned_short>
          (BaseAppender *this,Vector *col,hugeint_t input)

{
  bool bVar1;
  InvalidInputException *this_00;
  int64_t iVar2;
  hugeint_t input_00;
  unsigned_short result;
  uint16_t local_4a;
  string local_48;
  
  iVar2 = 0;
  bVar1 = TryCast::Operation<duckdb::hugeint_t,unsigned_short>(input,&local_4a,false);
  if (bVar1) {
    *(uint16_t *)(col->data + (this->chunk).count * 2) = local_4a;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.upper = iVar2;
  input_00.lower = input.upper;
  CastExceptionText<duckdb::hugeint_t,unsigned_short>(&local_48,(duckdb *)input.lower,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_48);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}